

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filename.cpp
# Opt level: O0

string * __thiscall
setup::filename_map::expand_variables(filename_map *this,it *begin,it end,bool close)

{
  byte bVar1;
  bool bVar2;
  slice_reader *psVar3;
  filename_map *in_RCX;
  filename_map *in_RDX;
  it in_RSI;
  string *in_RDI;
  byte in_R8B;
  ptrdiff_t obegin;
  it pos;
  string *result;
  __normal_iterator<const_setup::language_entry_*,_std::vector<setup::language_entry,_std::allocator<setup::language_entry>_>_>
  *in_stack_fffffffffffffee8;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffef0;
  undefined7 in_stack_fffffffffffffef8;
  undefined1 uVar4;
  string *key;
  filename_map *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff20;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffff28;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffff30;
  string local_c0 [32];
  char *local_a0;
  char *local_98;
  char *local_90;
  undefined1 local_82 [2];
  undefined8 local_80;
  char *local_78;
  undefined8 local_70;
  undefined8 local_68;
  char *local_60;
  char *local_58;
  undefined8 local_50;
  undefined8 local_48;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40 [2];
  undefined1 in_stack_ffffffffffffffd7;
  undefined6 in_stack_ffffffffffffffd8;
  undefined1 uVar5;
  
  bVar1 = in_R8B & 1;
  uVar5 = 0;
  key = in_RDI;
  std::__cxx11::string::string((string *)in_RDI);
  __gnu_cxx::operator-
            ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)in_stack_fffffffffffffef0._M_current,
             (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)in_stack_fffffffffffffee8);
  std::__cxx11::string::reserve((ulong)key);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)in_stack_fffffffffffffef0._M_current,
                       (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)in_stack_fffffffffffffee8);
    if (!bVar2) {
      return in_RDI;
    }
    local_40[0]._M_current =
         *(char **)&(in_RDX->
                    super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    )._M_t._M_impl;
    while( true ) {
      bVar2 = __gnu_cxx::operator!=
                        ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)in_stack_fffffffffffffef0._M_current,
                         (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)in_stack_fffffffffffffee8);
      uVar4 = false;
      if (bVar2) {
        psVar3 = boost::unordered::detail::
                 table<boost::unordered::detail::map<std::allocator<std::pair<unsigned_int_const,void*>>,unsigned_int,void*,boost::hash<unsigned_int>,std::equal_to<unsigned_int>>>
                 ::next_node((table<boost::unordered::detail::map<std::allocator<std::pair<unsigned_int_const,void*>>,unsigned_int,void*,boost::hash<unsigned_int>,std::equal_to<unsigned_int>>>
                              *)local_40);
        uVar4 = false;
        if ((char)psVar3->data_offset != '{') {
          psVar3 = boost::unordered::detail::
                   table<boost::unordered::detail::map<std::allocator<std::pair<unsigned_int_const,void*>>,unsigned_int,void*,boost::hash<unsigned_int>,std::equal_to<unsigned_int>>>
                   ::next_node((table<boost::unordered::detail::map<std::allocator<std::pair<unsigned_int_const,void*>>,unsigned_int,void*,boost::hash<unsigned_int>,std::equal_to<unsigned_int>>>
                                *)local_40);
          uVar4 = (char)psVar3->data_offset != '}';
        }
      }
      if ((bool)uVar4 == false) break;
      __gnu_cxx::
      __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(local_40);
    }
    local_48 = std::__cxx11::string::size();
    local_50 = *(undefined8 *)
                &(in_RDX->
                 super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 )._M_t._M_impl;
    local_58 = local_40[0]._M_current;
    std::__cxx11::string::
    append<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,void>
              (in_stack_ffffffffffffff20,in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    local_68 = std::__cxx11::string::begin();
    local_60 = (char *)__gnu_cxx::
                       __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       ::operator+((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    *)CONCAT17(uVar4,in_stack_fffffffffffffef8),
                                   in_stack_fffffffffffffef0._M_current);
    local_70 = std::__cxx11::string::end();
    local_80 = std::__cxx11::string::begin();
    local_78 = (char *)__gnu_cxx::
                       __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       ::operator+((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    *)CONCAT17(uVar4,in_stack_fffffffffffffef8),
                                   in_stack_fffffffffffffef0._M_current);
    local_82[0] = 0x24;
    in_stack_fffffffffffffef0 =
         std::
         replace_copy_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,setup::(anonymous_namespace)::is_unsafe_path_char,char>
                   (local_60,local_70,local_78,local_82);
    *(char **)&(in_RDX->
               super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               )._M_t._M_impl = local_40[0]._M_current;
    local_90 = in_stack_fffffffffffffef0._M_current;
    bVar2 = __gnu_cxx::operator==
                      ((__normal_iterator<const_setup::language_entry_*,_std::vector<setup::language_entry,_std::allocator<setup::language_entry>_>_>
                        *)in_stack_fffffffffffffef0._M_current,in_stack_fffffffffffffee8);
    if (bVar2) break;
    local_98 = (char *)__gnu_cxx::
                       __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       ::operator++((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                     *)CONCAT17(uVar4,in_stack_fffffffffffffef8),
                                    (int)((ulong)in_stack_fffffffffffffef0._M_current >> 0x20));
    if (((bVar1 & 1) != 0) &&
       (psVar3 = boost::unordered::detail::
                 table<boost::unordered::detail::map<std::allocator<std::pair<unsigned_int_const,void*>>,unsigned_int,void*,boost::hash<unsigned_int>,std::equal_to<unsigned_int>>>
                 ::next_node((table<boost::unordered::detail::map<std::allocator<std::pair<unsigned_int_const,void*>>,unsigned_int,void*,boost::hash<unsigned_int>,std::equal_to<unsigned_int>>>
                              *)local_40), (char)psVar3->data_offset == '}')) {
      return in_RDI;
    }
    if (((bVar1 & 1) == 0) &&
       (psVar3 = boost::unordered::detail::
                 table<boost::unordered::detail::map<std::allocator<std::pair<unsigned_int_const,void*>>,unsigned_int,void*,boost::hash<unsigned_int>,std::equal_to<unsigned_int>>>
                 ::next_node((table<boost::unordered::detail::map<std::allocator<std::pair<unsigned_int_const,void*>>,unsigned_int,void*,boost::hash<unsigned_int>,std::equal_to<unsigned_int>>>
                              *)local_40), (char)psVar3->data_offset == '}')) {
      std::__cxx11::string::push_back((char)key);
    }
    else {
      bVar2 = __gnu_cxx::operator!=
                        ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)in_stack_fffffffffffffef0._M_current,
                         (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)in_stack_fffffffffffffee8);
      if ((bVar2) &&
         (psVar3 = boost::unordered::detail::
                   table<boost::unordered::detail::map<std::allocator<std::pair<unsigned_int_const,void*>>,unsigned_int,void*,boost::hash<unsigned_int>,std::equal_to<unsigned_int>>>
                   ::next_node((table<boost::unordered::detail::map<std::allocator<std::pair<unsigned_int_const,void*>>,unsigned_int,void*,boost::hash<unsigned_int>,std::equal_to<unsigned_int>>>
                                *)in_RDX), (char)psVar3->data_offset == '{')) {
        std::__cxx11::string::push_back((char)key);
        local_a0 = (char *)__gnu_cxx::
                           __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           ::operator++((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                         *)CONCAT17(uVar4,in_stack_fffffffffffffef8),
                                        (int)((ulong)in_stack_fffffffffffffef0._M_current >> 0x20));
      }
      else {
        this_00 = in_RCX;
        expand_variables(in_RDX,(it *)CONCAT17(bVar1,CONCAT16(uVar5,in_stack_ffffffffffffffd8)),
                         in_RSI,(bool)in_stack_ffffffffffffffd7);
        lookup(this_00,key);
        std::__cxx11::string::append((string *)key);
        std::__cxx11::string::~string(local_c0);
        std::__cxx11::string::~string((string *)&stack0xffffffffffffff20);
      }
    }
  }
  return in_RDI;
}

Assistant:

std::string filename_map::expand_variables(it & begin, it end, bool close) const {
	
	std::string result;
	result.reserve(size_t(end - begin));
	
	while(begin != end) {
		
		// Flush everything before the next bracket
		it pos = begin;
		while(pos != end && *pos != '{' && *pos != '}') {
			++pos;
		}
		ptrdiff_t obegin = ptrdiff_t(result.size());
		result.append(begin, pos);
		std::replace_copy_if(result.begin() + obegin, result.end(), result.begin() + obegin,
		                     is_unsafe_path_char(), '$');
		begin = pos;
		
		if(pos == end) {
			// No more variables or escape sequences
			break;
		}
		
		begin++;
		
		if(close && *pos == '}') {
			// Current context closed
			break;
		}
		
		if(!close && *pos == '}') {
			// literal '}' character
			result.push_back('}');
			continue;
		}
		
		// '{{' escape sequence
		if(begin != end && *begin == '{') {
			result.push_back('{');
			begin++;
			continue;
		}
		
		// Recursively expand variables until we reach the end of this context
		result.append(lookup(expand_variables(begin, end, true)));
	}
	
	return result;
}